

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O0

void chirc_ctx_init(chirc_ctx_t *ctx)

{
  sds pcVar1;
  time_t local_18;
  time_t t;
  chirc_ctx_t *ctx_local;
  
  t = (time_t)ctx;
  local_18 = time((time_t *)0x0);
  *(undefined8 *)(t + 8) = 0;
  *(undefined8 *)(t + 0x10) = 0;
  *(undefined8 *)(t + 0x68) = 0;
  *(undefined8 *)(t + 0x18) = 0;
  *(undefined8 *)(t + 0x20) = 0;
  pcVar1 = sdsnew("chirc-0.6.0");
  *(sds *)(t + 0x28) = pcVar1;
  localtime_r(&local_18,(tm *)(t + 0x30));
  return;
}

Assistant:

void chirc_ctx_init(chirc_ctx_t *ctx)
{
    time_t t = time(NULL);

    ctx->channels = NULL;

    ctx->users = NULL;

    ctx->connections = NULL;

    ctx->network.this_server = NULL;
    ctx->network.servers = NULL;

    ctx->version = sdsnew(VERSION);
    localtime_r(&t, &ctx->created);
}